

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsCreators.cpp
# Opt level: O1

void chrono::utils::AddCylinderGeometry
               (ChBody *body,shared_ptr<chrono::ChMaterialSurface> *material,double radius,
               double hlen,ChVector<double> *pos,ChQuaternion<double> *rot,bool visualization,
               shared_ptr<chrono::ChVisualMaterial> *vis_material)

{
  double dVar1;
  element_type *peVar2;
  undefined1 auVar3 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  ChCylinderShape *this;
  ChBody *model;
  undefined1 auVar5 [16];
  element_type *in_XMM1_Qb;
  shared_ptr<chrono::ChCylinderShape> cylinder;
  shared_ptr<chrono::ChVisualShape> local_130;
  shared_ptr<chrono::ChVisualMaterial> local_120;
  ChCylinderShape *local_110;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_108;
  undefined1 local_100 [48];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d0;
  ChSystem *local_c8;
  element_type *peStack_c0;
  ChFrame<double> local_b8;
  
  peVar2 = (body->collision_model).
           super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var4 = (body->collision_model).
           super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  local_100._16_8_ =
       (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_100._24_8_ =
       (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._24_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._24_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._24_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._24_8_)->_M_use_count + 1;
    }
  }
  local_100._32_8_ = vis_material;
  local_c8 = (ChSystem *)hlen;
  peStack_c0 = in_XMM1_Qb;
  ChMatrix33<double>::ChMatrix33((ChMatrix33<double> *)&local_b8,rot);
  (*peVar2->_vptr_ChCollisionModel[8])(radius,radius,local_c8,peVar2,local_100 + 0x10,pos,&local_b8)
  ;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._24_8_);
  }
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  if (visualization) {
    model = body;
    ChPhysicsItem::GetVisualModel(&body->super_ChPhysicsItem);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8.coord.pos.m_data[0] !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8.coord.pos.m_data[0]);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._vptr_ChFrame ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x40);
      p_Var4->_M_use_count = 1;
      p_Var4->_M_weak_count = 1;
      p_Var4->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b33b18;
      local_100._0_8_ = p_Var4 + 1;
      p_Var4[1]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var4[1]._M_use_count = 0;
      p_Var4[1]._M_weak_count = 0;
      p_Var4[2]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var4[2]._M_use_count = 0;
      p_Var4[2]._M_weak_count = 0;
      p_Var4[2]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var4[2]._M_use_count = 0;
      p_Var4[2]._M_weak_count = 0;
      p_Var4[3]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var4[3]._M_use_count = 0;
      p_Var4[3]._M_weak_count = 0;
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = 2;
      }
      model = (ChBody *)local_100;
      local_100._8_8_ = p_Var4;
      ChPhysicsItem::AddVisualModel
                (&body->super_ChPhysicsItem,(shared_ptr<chrono::ChVisualModel> *)model);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_);
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
    this = (ChCylinderShape *)ChVisualShape::operator_new((ChVisualShape *)0x68,(size_t)model);
    ChCylinderShape::ChCylinderShape(this);
    local_110 = this;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChCylinderShape*>
              (&local_108,this);
    (local_110->gcylinder).rad = radius;
    (local_110->gcylinder).p1.m_data[0] = 0.0;
    auVar3._8_8_ = peStack_c0;
    auVar3._0_8_ = local_c8;
    (local_110->gcylinder).p1.m_data[1] = (double)local_c8;
    auVar5._8_8_ = 0x8000000000000000;
    auVar5._0_8_ = 0x8000000000000000;
    auVar5 = vxorpd_avx512vl(auVar3,auVar5);
    (local_110->gcylinder).p1.m_data[2] = 0.0;
    (local_110->gcylinder).p2.m_data[0] = 0.0;
    dVar1 = (double)vmovlpd_avx(auVar5);
    (local_110->gcylinder).p2.m_data[1] = dVar1;
    (local_110->gcylinder).p2.m_data[2] = 0.0;
    local_120.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)local_100._32_8_;
    local_120.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_100._32_8_ + 8))->_M_pi;
    if (local_120.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_120.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_120.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_120.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_120.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    ChVisualShape::AddMaterial(&local_110->super_ChVisualShape,&local_120);
    if (local_120.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_120.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    ChPhysicsItem::GetVisualModel(&body->super_ChPhysicsItem);
    local_130.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_110->super_ChVisualShape;
    local_130.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = local_108._M_pi;
    if (local_108._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_108._M_pi)->_M_use_count = (local_108._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_108._M_pi)->_M_use_count = (local_108._M_pi)->_M_use_count + 1;
      }
    }
    local_b8._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b2b308;
    local_b8.coord.pos.m_data[0] = pos->m_data[0];
    local_b8.coord.pos.m_data[1] = pos->m_data[1];
    local_b8.coord.pos.m_data[2] = pos->m_data[2];
    local_b8.coord.rot.m_data[0] = rot->m_data[0];
    local_b8.coord.rot.m_data[1] = rot->m_data[1];
    local_b8.coord.rot.m_data[2] = rot->m_data[2];
    local_b8.coord.rot.m_data[3] = rot->m_data[3];
    ChMatrix33<double>::ChMatrix33(&local_b8.Amatrix,rot);
    ChVisualModel::AddShape((ChVisualModel *)local_100._40_8_,&local_130,&local_b8);
    if (local_130.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_130.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0);
    }
    if (local_108._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_108._M_pi);
    }
  }
  return;
}

Assistant:

void AddCylinderGeometry(ChBody* body,
                         std::shared_ptr<ChMaterialSurface> material,
                         double radius,
                         double hlen,
                         const ChVector<>& pos,
                         const ChQuaternion<>& rot,
                         bool visualization,
                         std::shared_ptr<ChVisualMaterial> vis_material) {
    body->GetCollisionModel()->AddCylinder(material, radius, radius, hlen, pos, rot);

    if (visualization) {
        if (!body->GetVisualModel()) {
            auto model = chrono_types::make_shared<ChVisualModel>();
            body->AddVisualModel(model);
        }
        auto cylinder = chrono_types::make_shared<ChCylinderShape>();
        cylinder->GetCylinderGeometry().rad = radius;
        cylinder->GetCylinderGeometry().p1 = ChVector<>(0, hlen, 0);
        cylinder->GetCylinderGeometry().p2 = ChVector<>(0, -hlen, 0);
        cylinder->AddMaterial(vis_material);
        body->GetVisualModel()->AddShape(cylinder, ChFrame<>(pos, rot));
    }
}